

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_scalar_event_initialize
              (yaml_event_t *event,yaml_char_t *anchor,yaml_char_t *tag,yaml_char_t *value,
              int length,int plain_implicit,int quoted_implicit,yaml_scalar_style_t style)

{
  int iVar1;
  size_t sVar2;
  yaml_tag_directive_t *__dest;
  yaml_char_t *value_copy;
  yaml_char_t *tag_copy;
  yaml_char_t *anchor_copy;
  yaml_mark_t mark;
  int plain_implicit_local;
  int length_local;
  yaml_char_t *value_local;
  yaml_char_t *tag_local;
  yaml_char_t *anchor_local;
  yaml_event_t *event_local;
  
  mark.column._0_4_ = plain_implicit;
  mark.column._4_4_ = length;
  memset(&anchor_copy,0,0x18);
  tag_copy = (yaml_char_t *)0x0;
  value_copy = (yaml_char_t *)0x0;
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x340,
                  "int yaml_scalar_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, yaml_char_t *, int, int, int, yaml_scalar_style_t)"
                 );
  }
  if (value == (yaml_char_t *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x341,
                  "int yaml_scalar_event_initialize(yaml_event_t *, yaml_char_t *, yaml_char_t *, yaml_char_t *, int, int, int, yaml_scalar_style_t)"
                 );
  }
  if (anchor != (yaml_char_t *)0x0) {
    sVar2 = strlen((char *)anchor);
    iVar1 = yaml_check_utf8(anchor,sVar2);
    if ((iVar1 == 0) || (tag_copy = yaml_strdup(anchor), tag_copy == (yaml_char_t *)0x0))
    goto LAB_00105fed;
  }
  if (tag != (yaml_char_t *)0x0) {
    sVar2 = strlen((char *)tag);
    iVar1 = yaml_check_utf8(tag,sVar2);
    if ((iVar1 == 0) || (value_copy = yaml_strdup(tag), value_copy == (yaml_char_t *)0x0))
    goto LAB_00105fed;
  }
  if (mark.column._4_4_ < 0) {
    sVar2 = strlen((char *)value);
    mark.column._4_4_ = (int)sVar2;
  }
  iVar1 = yaml_check_utf8(value,(long)mark.column._4_4_);
  if ((iVar1 != 0) &&
     (__dest = (yaml_tag_directive_t *)yaml_malloc((long)(mark.column._4_4_ + 1)),
     __dest != (yaml_tag_directive_t *)0x0)) {
    memcpy(__dest,value,(long)mark.column._4_4_);
    *(undefined1 *)((long)&__dest->handle + (long)mark.column._4_4_) = 0;
    memset(event,0,0x68);
    event->type = YAML_SCALAR_EVENT;
    (event->start_mark).index = (size_t)anchor_copy;
    (event->start_mark).line = mark.index;
    (event->start_mark).column = mark.line;
    (event->end_mark).index = (size_t)anchor_copy;
    (event->end_mark).line = mark.index;
    (event->end_mark).column = mark.line;
    (event->data).scalar.anchor = tag_copy;
    (event->data).scalar.tag = value_copy;
    (event->data).document_start.tag_directives.end = __dest;
    *(long *)((long)&event->data + 0x18) = (long)mark.column._4_4_;
    (event->data).scalar.plain_implicit = (int)mark.column;
    (event->data).scalar.quoted_implicit = quoted_implicit;
    (event->data).scalar.style = style;
    return 1;
  }
LAB_00105fed:
  yaml_free(tag_copy);
  yaml_free(value_copy);
  yaml_free((void *)0x0);
  return 0;
}

Assistant:

YAML_DECLARE(int)
yaml_scalar_event_initialize(yaml_event_t *event,
        yaml_char_t *anchor, yaml_char_t *tag,
        yaml_char_t *value, int length,
        int plain_implicit, int quoted_implicit,
        yaml_scalar_style_t style)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;
    yaml_char_t *tag_copy = NULL;
    yaml_char_t *value_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */
    assert(value);      /* Non-NULL anchor is expected. */

    if (anchor) {
        if (!yaml_check_utf8(anchor, strlen((char *)anchor))) goto error;
        anchor_copy = yaml_strdup(anchor);
        if (!anchor_copy) goto error;
    }

    if (tag) {
        if (!yaml_check_utf8(tag, strlen((char *)tag))) goto error;
        tag_copy = yaml_strdup(tag);
        if (!tag_copy) goto error;
    }

    if (length < 0) {
        length = strlen((char *)value);
    }

    if (!yaml_check_utf8(value, length)) goto error;
    value_copy = YAML_MALLOC(length+1);
    if (!value_copy) goto error;
    memcpy(value_copy, value, length);
    value_copy[length] = '\0';

    SCALAR_EVENT_INIT(*event, anchor_copy, tag_copy, value_copy, length,
            plain_implicit, quoted_implicit, style, mark, mark);

    return 1;

error:
    yaml_free(anchor_copy);
    yaml_free(tag_copy);
    yaml_free(value_copy);

    return 0;
}